

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alGetListeneri(void)

{
  ALenum param_00;
  int32 value_00;
  ALint *origvalue_00;
  ALint value;
  ALint *origvalue;
  undefined1 local_230 [4];
  ALenum param;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)local_230);
  if (io_failure == 0) {
    param_00 = IO_ENUM();
    origvalue_00 = (ALint *)IO_PTR();
    value_00 = IO_INT32();
    if (io_failure == 0) {
      visit_alGetListeneri((CallerInfo *)local_230,param_00,origvalue_00,value_00);
    }
  }
  return;
}

Assistant:

static void decode_alGetListeneri(void)
{
    IO_START(alGetListeneri);
    const ALenum param = IO_ENUM();
    ALint *origvalue = (ALint *) IO_PTR();
    const ALint value = IO_INT32();

    if (!io_failure) visit_alGetListeneri(&callerinfo, param, origvalue, value);

    IO_END();
}